

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Result::~Result(Result *this)

{
  Result *this_local;
  
  std::__cxx11::string::~string((string *)&this->body);
  std::__cxx11::string::~string((string *)&this->msg);
  return;
}

Assistant:

Result(const CURLcode& code) {
            curl_code = code;
            msg = curl_easy_strerror(code);
        }